

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_binary.h
# Opt level: O3

vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
* __thiscall
lf::mesh::utils::internal::OperatorSubtraction::operator()
          (vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
           *__return_storage_ptr__,OperatorSubtraction *this,
          vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          *u,vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
             *v,int param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  double dVar5;
  ulong uVar6;
  long lVar7;
  pointer pMVar8;
  stringstream ss;
  string local_238;
  string local_218;
  string local_1f8;
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_1d8;
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  *local_1c0;
  undefined1 local_1b8 [392];
  
  local_1c0 = __return_storage_ptr__;
  std::
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  ::vector(&local_1d8,
           (long)(u->
                 super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(u->
                 super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)local_1b8);
  pMVar8 = (u->
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((u->
      super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pMVar8) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      if (*(long *)((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                           m_storage.m_rows + lVar7) != 2) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),
                   "mismatch in #rows of matrices subtracted from each other.",0x39);
        paVar1 = &local_238.field_2;
        local_238._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"u[i].rows() == v[i].rows()","");
        paVar2 = &local_218.field_2;
        local_218._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_218,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_binary.h"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_238,&local_218,0x145,&local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != paVar2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != paVar1) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        local_238._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"false","");
        local_218._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_218,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_binary.h"
                   ,"");
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
        base::AssertionFailed(&local_238,&local_218,0x145,&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_238);
        abort();
      }
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
                       *)local_1b8,
                      (Lhs *)((long)&(pMVar8->
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                                     .m_storage.m_data + lVar7),
                      (Rhs *)((long)&(((v->
                                       super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->
                                     super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
                                     m_storage.m_data + lVar7),
                      (scalar_difference_op<double,_double> *)&local_238);
      pdVar3 = (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1b8._0_8_)->
               m_storage).m_data;
      dVar5 = pdVar3[1] -
              (((PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_1b8._8_8_)->
              m_storage).m_data.array[1];
      auVar4._8_4_ = SUB84(dVar5,0);
      auVar4._0_8_ = *pdVar3 - (((PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
                                local_1b8._8_8_)->m_storage).m_data.array[0];
      auVar4._12_4_ = (int)((ulong)dVar5 >> 0x20);
      *(undefined1 (*) [16])
       ((long)((local_1d8.
                super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array +
       lVar7) = auVar4;
      uVar6 = uVar6 + 1;
      pMVar8 = (u->
               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x10;
    } while (uVar6 < (ulong)((long)(u->
                                   super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar8 >> 4))
    ;
  }
  (local_1c0->
  super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       local_1d8.
       super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (local_1c0->
  super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       local_1d8.
       super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (local_1c0->
  super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1d8.
       super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  return local_1c0;
}

Assistant:

auto operator()(const std::vector<Eigen::Matrix<S1, R1, C1, O1, MR1, MC1>>& u,
                  const std::vector<Eigen::Matrix<S2, R2, C2, O2, MR2, MC2>>& v,
                  int /*unused*/) const {
    using scalar_t = decltype(S1(0) + S2(0));  // NOLINT
    if constexpr (R1 != Eigen::Dynamic && C1 != Eigen::Dynamic &&
                  R2 != Eigen::Dynamic && C2 != Eigen::Dynamic) {  // NOLINT
      // subtract two static size eigen matrices from each other
      static_assert(R1 == R2, "cannot subtract matrices with different #rows.");
      static_assert(C1 == C2, "cannot subtract matrices with different #cols.");

      Eigen::Map<const Eigen::Matrix<S1, 1, Eigen::Dynamic>> um(
          &u[0](0, 0), 1, u.size() * R1 * C1);
      Eigen::Map<const Eigen::Matrix<S2, 1, Eigen::Dynamic>> vm(
          &v[0](0, 0), 1, v.size() * R1 * C1);

      std::vector<Eigen::Matrix<scalar_t, R1, C1>> result(u.size());
      Eigen::Map<Eigen::Matrix<scalar_t, 1, Eigen::Dynamic>> rm(
          &result[0](0, 0), 1, u.size() * R1 * C1);
      rm = um - vm;
      return result;
    }
    if constexpr ((R1 != Eigen::Dynamic && C1 != Eigen::Dynamic) ||
                  (R2 != Eigen::Dynamic && C2 != Eigen::Dynamic)) {  // NOLINT
      // One of the matrices is fixed size:
      constexpr int fixedRows = std::max(R1, R2);
      constexpr int fixedCols = std::max(C1, C2);

      std::vector<Eigen::Matrix<scalar_t, fixedRows, fixedCols>> result(
          u.size());
      for (std::size_t i = 0; i < u.size(); ++i) {
        LF_ASSERT_MSG(
            u[i].rows() == v[i].rows(),
            "mismatch in #rows of matrices subtracted from each other.");
        LF_ASSERT_MSG(
            u[i].cols() == v[i].cols(),
            "mismatch in #cols of matrices subtracted from each other.");
        result[i] = u[i] - v[i];
      }
      return result;
    } else {  // NOLINT
      // subtract two dynamic sized matrices from each other:
      std::vector<Eigen::Matrix<scalar_t, Eigen::Dynamic, Eigen::Dynamic>>
          result;
      result.reserve(u.size());
      for (unsigned long i = 0; i < u.size(); ++i) {
        LF_ASSERT_MSG(
            u[i].rows() == v[i].rows(),
            "mismatch in #rows of matrices subtracted from each other.");
        LF_ASSERT_MSG(
            u[i].cols() == v[i].cols(),
            "mismatch in #cols of matrices subtracted from each other.");
        result.emplace_back(u[i] - v[i]);
      }
      return result;
    }
  }